

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakSponge.c
# Opt level: O2

int InitSponge(spongeState *state,uint rate,uint capacity)

{
  uint uVar1;
  void *pvVar2;
  
  uVar1 = capacity + rate ^ 0x640;
  if ((rate & 0x3f) == 0 && uVar1 == 0) {
    state->rate = rate;
    state->capacity = capacity;
    memset(state,0,200);
    state->state[0x40] = 0xff;
    state->state[0x41] = 0xff;
    state->state[0x42] = 0xff;
    state->state[0x43] = 0xff;
    state->state[0x44] = 0xff;
    state->state[0x45] = 0xff;
    state->state[0x46] = 0xff;
    state->state[0x47] = 0xff;
    state->state[0x60] = 0xff;
    state->state[0x61] = 0xff;
    state->state[0x62] = 0xff;
    state->state[99] = 0xff;
    state->state[100] = 0xff;
    state->state[0x65] = 0xff;
    state->state[0x66] = 0xff;
    state->state[0x67] = 0xff;
    state->state[0x88] = 0xff;
    state->state[0x89] = 0xff;
    state->state[0x8a] = 0xff;
    state->state[0x8b] = 0xff;
    state->state[0x8c] = 0xff;
    state->state[0x8d] = 0xff;
    state->state[0x8e] = 0xff;
    state->state[0x8f] = 0xff;
    state->state[0xa0] = 0xff;
    state->state[0xa1] = 0xff;
    state->state[0xa2] = 0xff;
    state->state[0xa3] = 0xff;
    state->state[0xa4] = 0xff;
    state->state[0xa5] = 0xff;
    state->state[0xa6] = 0xff;
    state->state[0xa7] = 0xff;
    state->state[8] = 0xff;
    state->state[9] = 0xff;
    state->state[10] = 0xff;
    state->state[0xb] = 0xff;
    state->state[0xc] = 0xff;
    state->state[0xd] = 0xff;
    state->state[0xe] = 0xff;
    state->state[0xf] = 0xff;
    state->state[0x10] = 0xff;
    state->state[0x11] = 0xff;
    state->state[0x12] = 0xff;
    state->state[0x13] = 0xff;
    state->state[0x14] = 0xff;
    state->state[0x15] = 0xff;
    state->state[0x16] = 0xff;
    state->state[0x17] = 0xff;
    pvVar2 = memset(state->dataQueue,0,0xc0);
    uVar1 = (uint)pvVar2;
    state->bitsInQueue = 0;
    state->fixedOutputLength = 0;
    state->squeezing = 0;
    state->bitsAvailableForSqueezing = 0;
  }
  return uVar1;
}

Assistant:

static int InitSponge(spongeState *state, unsigned int rate, unsigned int capacity)
{
    if (rate+capacity != 1600)
        return 1;
    if ((rate <= 0) || (rate >= 1600) || ((rate % 64) != 0))
        return 1;
    KeccakInitialize();
    state->rate = rate;
    state->capacity = capacity;
    state->fixedOutputLength = 0;
    KeccakInitializeState(state->state);
    memset(state->dataQueue, 0, KeccakMaximumRateInBytes);
    state->bitsInQueue = 0;
    state->squeezing = 0;
    state->bitsAvailableForSqueezing = 0;

    return 0;
}